

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiContextTests.cpp
# Opt level: O1

TestCaseGroup * deqp::egl::createMultiContextTests(EglTestContext *eglTestCtx)

{
  TestCaseGroup *this;
  TestCase *pTVar1;
  
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,eglTestCtx,"multicontext","EGL multi context tests.");
  pTVar1 = (TestCase *)operator_new(0x80);
  TestCase::TestCase(pTVar1,eglTestCtx,"non_shared","Create multiple non-shared contexts.");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_003ed900;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x80);
  TestCase::TestCase(pTVar1,eglTestCtx,"shared","Create multiple shared contexts.");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_003ed900;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x1;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x80);
  TestCase::TestCase(pTVar1,eglTestCtx,"non_shared_make_current",
                     "Create multiple non-shared contexts.");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_003ed900;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x100000000;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x80);
  TestCase::TestCase(pTVar1,eglTestCtx,"shared_make_current","Create multiple shared contexts.");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_003ed900;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x100000001;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x80);
  TestCase::TestCase(pTVar1,eglTestCtx,"non_shared_clear","Create multiple non-shared contexts.");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_003ed900;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x200000000;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x80);
  TestCase::TestCase(pTVar1,eglTestCtx,"shared_clear","Create multiple shared contexts.");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_003ed900;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x200000001;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return this;
}

Assistant:

TestCaseGroup* createMultiContextTests (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "multicontext", "EGL multi context tests."));

	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_NONE,	MultiContextTest::USE_NONE,			"non_shared",				"Create multiple non-shared contexts."));
	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_SHARED,	MultiContextTest::USE_NONE,			"shared",					"Create multiple shared contexts."));

	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_NONE,	MultiContextTest::USE_MAKECURRENT,	"non_shared_make_current",	"Create multiple non-shared contexts."));
	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_SHARED,	MultiContextTest::USE_MAKECURRENT,	"shared_make_current",		"Create multiple shared contexts."));

	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_NONE,	MultiContextTest::USE_CLEAR,		"non_shared_clear",			"Create multiple non-shared contexts."));
	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_SHARED,	MultiContextTest::USE_CLEAR,		"shared_clear",				"Create multiple shared contexts."));

	return group.release();
}